

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Result __thiscall testing::Action<void_()>::Perform(Action<void_()> *this,ArgumentTuple *args)

{
  bool bVar1;
  ActionInterface<void_()> *pAVar2;
  allocator local_39;
  string local_38;
  ArgumentTuple *local_18;
  ArgumentTuple *args_local;
  Action<void_()> *this_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)this;
  bVar1 = IsDoDefault(this);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_39);
  internal::Assert(!bVar1,
                   "/workspace/llm4binary/github/license_c_cmakelists/DanRuta[P]webassembly-workflow/test/googletest/googlemock/include/gmock/gmock-actions.h"
                   ,0x185,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pAVar2 = internal::linked_ptr<testing::ActionInterface<void_()>_>::operator->(&this->impl_);
  (**(code **)(*(long *)pAVar2 + 0x10))(pAVar2,local_18);
  return;
}

Assistant:

Result Perform(const ArgumentTuple& args) const {
    internal::Assert(
        !IsDoDefault(), __FILE__, __LINE__,
        "You are using DoDefault() inside a composite action like "
        "DoAll() or WithArgs().  This is not supported for technical "
        "reasons.  Please instead spell out the default action, or "
        "assign the default action to an Action variable and use "
        "the variable in various places.");
    return impl_->Perform(args);
  }